

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O3

int32 __thiscall
rw::PluginList::registerPlugin
          (PluginList *this,int32 size,uint32 id,Constructor ctor,Destructor dtor,
          CopyConstructor copy)

{
  int iVar1;
  LLLink *pLVar2;
  int *piVar3;
  code *pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/plg.cpp line: 171"
  ;
  piVar3 = (int *)(*Engine::memfuncs)(0x78,0x40000);
  iVar1 = this->size;
  *piVar3 = iVar1;
  this->size = iVar1 + size + 7U & 0xfffffff8;
  piVar3[1] = size;
  piVar3[2] = id;
  auVar5._8_8_ = dtor;
  auVar5._0_8_ = ctor;
  auVar6._0_4_ = -(uint)((int)ctor == 0);
  auVar6._4_4_ = -(uint)((int)((ulong)ctor >> 0x20) == 0);
  auVar6._8_4_ = -(uint)((int)dtor == 0);
  auVar6._12_4_ = -(uint)((int)((ulong)dtor >> 0x20) == 0);
  auVar7._4_4_ = auVar6._0_4_;
  auVar7._0_4_ = auVar6._4_4_;
  auVar7._8_4_ = auVar6._12_4_;
  auVar7._12_4_ = auVar6._8_4_;
  auVar8._8_8_ = defDtor;
  auVar8._0_8_ = defCtor;
  *(undefined1 (*) [16])(piVar3 + 4) = ~(auVar7 & auVar6) & auVar5 | auVar8 & auVar7 & auVar6;
  pcVar4 = defCopy;
  if (copy != (CopyConstructor)0x0) {
    pcVar4 = copy;
  }
  *(code **)(piVar3 + 8) = pcVar4;
  *(undefined1 (*) [16])(piVar3 + 10) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(piVar3 + 0xe) = (undefined1  [16])0x0;
  piVar3[0x12] = 0;
  piVar3[0x13] = 0;
  *(PluginList **)(piVar3 + 0x14) = this;
  pLVar2 = (this->plugins).link.next;
  *(LLLink **)(piVar3 + 0x16) = pLVar2;
  *(LinkList **)(piVar3 + 0x18) = &this->plugins;
  pLVar2->prev = (LLLink *)(piVar3 + 0x16);
  (this->plugins).link.next = (LLLink *)(piVar3 + 0x16);
  *(int **)(piVar3 + 0x1a) = allPlugins;
  *(int ***)(piVar3 + 0x1c) = &allPlugins;
  *(int **)((long)allPlugins + 8) = piVar3 + 0x1a;
  allPlugins = piVar3 + 0x1a;
  return iVar1;
}

Assistant:

int32
PluginList::registerPlugin(int32 size, uint32 id,
	Constructor ctor, Destructor dtor, CopyConstructor copy)
{
	Plugin *p = (Plugin*)rwMalloc(sizeof(Plugin), MEMDUR_GLOBAL);
	p->offset = this->size;
	this->size += size;
	int32 round = sizeof(void*)-1;
	this->size = (this->size + round)&~round;

	p->size = size;
	p->id = id;
	p->constructor = ctor ? ctor : defCtor;
	p->destructor = dtor ? dtor : defDtor;
	p->copy = copy ? copy : defCopy;
	p->read = nil;
	p->write = nil;
	p->getSize = nil;
	p->rightsCallback = nil;
	p->alwaysCallback = nil;
	p->parentList = this;
	this->plugins.add(&p->inParentList);
	allPlugins.add(&p->inGlobalList);
	return p->offset;
}